

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotor.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMotor::ArchiveIN(ChLinkMotor *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotor>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  local_28._value = &this->m_func;
  local_28._name = "m_func";
  local_28._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMotor::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotor>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(m_func);
}